

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::AttachShader::AttachShader
          (AttachShader *this,SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program,
          SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *shader,bool useSync,bool serverSync)

{
  GLenum GVar1;
  long lStack_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_48;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_38;
  
  Operation::Operation(&this->super_Operation,"AttachShader",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__AttachShader_01e00648;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr(&this->m_program,program);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr(&this->m_shader,shader);
  local_38.m_ptr = &((this->m_program).m_ptr)->super_Object;
  local_38.m_state = (this->m_program).m_state;
  if (local_38.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_38.m_state)->strongRefCount = (local_38.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_38.m_state)->weakRefCount = (local_38.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_38);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_38);
  local_48.m_ptr = &((this->m_shader).m_ptr)->super_Object;
  local_48.m_state = (this->m_shader).m_state;
  if (local_48.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_48.m_state)->strongRefCount = (local_48.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_48.m_state)->weakRefCount = (local_48.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::readGLObject(&this->super_Operation,&local_48);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_48);
  GVar1 = ((this->m_shader).m_ptr)->type;
  if (GVar1 == 0x8b30) {
    lStack_50 = 0x70;
  }
  else {
    if (GVar1 != 0x8b31) {
      return;
    }
    lStack_50 = 0x60;
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator=
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)
             ((long)&(((this->m_program).m_ptr)->super_Object).super_Object._vptr_Object + lStack_50
             ),shader);
  return;
}

Assistant:

AttachShader::AttachShader (SharedPtr<Program> program, SharedPtr<Shader> shader, bool useSync, bool serverSync)
	: Operation	("AttachShader", useSync, serverSync)
	, m_program	(program)
	, m_shader	(shader)
{
	modifyGLObject(SharedPtr<Object>(m_program));
	readGLObject(SharedPtr<Object>(m_shader));

	if (m_shader->type == GL_VERTEX_SHADER)
		m_program->vertexShader = shader;
	else if (m_shader->type == GL_FRAGMENT_SHADER)
		m_program->fragmentShader = shader;
	else
		DE_ASSERT(false);
}